

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *param_1,Hasher *h,VkPipelineRenderingCreateInfoKHR *info,
               VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  bool bVar1;
  uint local_2c;
  uint32_t i;
  bool view_mask_sensitive;
  bool format_sensitive;
  VkGraphicsPipelineLibraryFlagsEXT state_flags_local;
  VkPipelineRenderingCreateInfoKHR *info_local;
  Hasher *h_local;
  StateRecorder *param_0_local;
  
  bVar1 = (state_flags & 8) != 0;
  if (bVar1) {
    Hasher::u32(h,info->colorAttachmentCount);
  }
  if ((state_flags & 0xe) != 0) {
    Hasher::u32(h,info->viewMask);
  }
  if (bVar1) {
    for (local_2c = 0; local_2c < info->colorAttachmentCount; local_2c = local_2c + 1) {
      Hasher::u32(h,info->pColorAttachmentFormats[local_2c]);
    }
    Hasher::u32(h,info->depthAttachmentFormat);
    Hasher::u32(h,info->stencilAttachmentFormat);
  }
  return;
}

Assistant:

static void hash_pnext_struct(const StateRecorder *,
                              Hasher &h,
                              const VkPipelineRenderingCreateInfoKHR &info,
                              VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	bool format_sensitive = (state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT) != 0;
	bool view_mask_sensitive = (state_flags & (VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT |
	                                           VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT |
	                                           VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT)) != 0;

	// Keep hash order for hash compat.

	if (format_sensitive)
		h.u32(info.colorAttachmentCount);

	if (view_mask_sensitive)
		h.u32(info.viewMask);

	if (format_sensitive)
	{
		for (uint32_t i = 0; i < info.colorAttachmentCount; i++)
			h.u32(info.pColorAttachmentFormats[i]);
		h.u32(info.depthAttachmentFormat);
		h.u32(info.stencilAttachmentFormat);
	}
}